

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeStatement(ExpressionContext *ctx,SynBase *syntax)

{
  bool bVar1;
  int iVar2;
  ExprAliasDefinition *pEVar3;
  SynBase *expr;
  undefined4 extraout_var;
  TypeBase *pTVar5;
  ExprDoWhile *pEVar6;
  ExprContinue *pEVar7;
  ExprVariableDefinitions *pEVar8;
  ExprSwitch *pEVar9;
  ExprBreak *pEVar10;
  ExprWhile *pEVar11;
  ExprFor *pEVar12;
  ExprBlock *pEVar13;
  ExprBase *pEVar14;
  SynFunctionDefinition *node;
  SynBase *pSVar4;
  
  if (syntax != (SynBase *)0x0) {
    switch(syntax->typeID) {
    case 0x16:
      pEVar3 = AnalyzeTypedef(ctx,(SynTypedef *)syntax);
      return &pEVar3->super_ExprBase;
    case 0x22:
      pEVar14 = AnalyzeReturn(ctx,(SynReturn *)syntax);
      return pEVar14;
    case 0x23:
      pEVar14 = AnalyzeYield(ctx,(SynYield *)syntax);
      return pEVar14;
    case 0x24:
      pEVar10 = AnalyzeBreak(ctx,(SynBreak *)syntax);
      return &pEVar10->super_ExprBase;
    case 0x25:
      pEVar7 = AnalyzeContinue(ctx,(SynContinue *)syntax);
      return &pEVar7->super_ExprBase;
    case 0x26:
      pEVar13 = AnalyzeBlock(ctx,(SynBlock *)syntax,true);
      return &pEVar13->super_ExprBase;
    case 0x27:
      pEVar14 = AnalyzeIfElse(ctx,(SynIfElse *)syntax);
      return pEVar14;
    case 0x28:
      pEVar12 = AnalyzeFor(ctx,(SynFor *)syntax);
      return &pEVar12->super_ExprBase;
    case 0x2a:
      pEVar12 = AnalyzeForEach(ctx,(SynForEach *)syntax);
      return &pEVar12->super_ExprBase;
    case 0x2b:
      pEVar11 = AnalyzeWhile(ctx,(SynWhile *)syntax);
      return &pEVar11->super_ExprBase;
    case 0x2c:
      pEVar6 = AnalyzeDoWhile(ctx,(SynDoWhile *)syntax);
      return &pEVar6->super_ExprBase;
    case 0x2e:
      pEVar9 = AnalyzeSwitch(ctx,(SynSwitch *)syntax);
      return &pEVar9->super_ExprBase;
    case 0x34:
      pEVar8 = AnalyzeVariableDefinitions(ctx,(SynVariableDefinitions *)syntax);
      return &pEVar8->super_ExprBase;
    case 0x37:
      pEVar14 = AnalyzeFunctionDefinition
                          (ctx,(SynFunctionDefinition *)syntax,(FunctionData *)0x0,
                           (TypeFunction *)0x0,(TypeBase *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),
                           true,false,true);
      return pEVar14;
    case 0x3c:
      pEVar14 = AnalyzeClassPrototype(ctx,(SynClassPrototype *)syntax);
      return pEVar14;
    case 0x3f:
      pEVar14 = AnalyzeClassDefinition
                          (ctx,(SynClassDefinition *)syntax,(TypeGenericClassProto *)0x0,
                           (IntrusiveList<TypeHandle>)ZEXT816(0));
      return pEVar14;
    case 0x40:
      pEVar14 = AnalyzeEnumDefinition(ctx,(SynEnumDefinition *)syntax);
      return pEVar14;
    case 0x41:
      pEVar13 = AnalyzeNamespaceDefinition(ctx,(SynNamespaceDefinition *)syntax);
      return &pEVar13->super_ExprBase;
    }
  }
  expr = (SynBase *)AnalyzeExpression(ctx,syntax);
  bVar1 = AssertValueExpression(ctx,syntax,(ExprBase *)expr);
  pSVar4 = expr;
  if (!bVar1) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pSVar4 = (SynBase *)CONCAT44(extraout_var,iVar2);
    pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ((ExprBase *)pSVar4)->typeID = 0;
    ((ExprBase *)pSVar4)->source = syntax;
    ((ExprBase *)pSVar4)->type = pTVar5;
    ((ExprBase *)pSVar4)->next = (ExprBase *)0x0;
    ((ExprBase *)pSVar4)->listed = false;
    ((ExprBase *)pSVar4)->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00223b38;
    ((ExprBase *)((long)pSVar4 + 0x60))->_vptr_ExprBase = (_func_int **)0x0;
    ((ExprBase *)((long)pSVar4 + 0x30))->_vptr_ExprBase =
         (_func_int **)&((ExprBase *)((long)pSVar4 + 0x30))->source;
    *(undefined8 *)&((ExprBase *)((long)pSVar4 + 0x30))->typeID = 0x400000001;
    ((ExprBase *)((long)pSVar4 + 0x30))->source = expr;
  }
  return (ExprBase *)pSVar4;
}

Assistant:

ExprBase* AnalyzeStatement(ExpressionContext &ctx, SynBase *syntax)
{
	if(SynReturn *node = getType<SynReturn>(syntax))
	{
		return AnalyzeReturn(ctx, node);
	}

	if(SynYield *node = getType<SynYield>(syntax))
	{
		return AnalyzeYield(ctx, node);
	}

	if(SynVariableDefinitions *node = getType<SynVariableDefinitions>(syntax))
	{
		return AnalyzeVariableDefinitions(ctx, node);
	}

	if(SynFunctionDefinition *node = getType<SynFunctionDefinition>(syntax))
	{
		return AnalyzeFunctionDefinition(ctx, node, NULL, NULL, NULL, IntrusiveList<MatchData>(), true, false, true);
	}

	if(SynClassDefinition *node = getType<SynClassDefinition>(syntax))
	{
		IntrusiveList<TypeHandle> generics;

		return AnalyzeClassDefinition(ctx, node, NULL, generics);
	}

	if(SynClassPrototype *node = getType<SynClassPrototype>(syntax))
	{
		return AnalyzeClassPrototype(ctx, node);
	}

	if(SynEnumDefinition *node = getType<SynEnumDefinition>(syntax))
	{
		return AnalyzeEnumDefinition(ctx, node);
	}

	if(SynNamespaceDefinition *node = getType<SynNamespaceDefinition>(syntax))
	{
		return AnalyzeNamespaceDefinition(ctx, node);
	}

	if(SynTypedef *node = getType<SynTypedef>(syntax))
	{
		return AnalyzeTypedef(ctx, node);
	}

	if(SynIfElse *node = getType<SynIfElse>(syntax))
	{
		return AnalyzeIfElse(ctx, node);
	}

	if(SynFor *node = getType<SynFor>(syntax))
	{
		return AnalyzeFor(ctx, node);
	}

	if(SynForEach *node = getType<SynForEach>(syntax))
	{
		return AnalyzeForEach(ctx, node);
	}

	if(SynWhile *node = getType<SynWhile>(syntax))
	{
		return AnalyzeWhile(ctx, node);
	}

	if(SynDoWhile *node = getType<SynDoWhile>(syntax))
	{
		return AnalyzeDoWhile(ctx, node);
	}

	if(SynSwitch *node = getType<SynSwitch>(syntax))
	{
		return AnalyzeSwitch(ctx, node);
	}

	if(SynBreak *node = getType<SynBreak>(syntax))
	{
		return AnalyzeBreak(ctx, node);
	}

	if(SynContinue *node = getType<SynContinue>(syntax))
	{
		return AnalyzeContinue(ctx, node);
	}

	if(SynBlock *node = getType<SynBlock>(syntax))
	{
		return AnalyzeBlock(ctx, node, true);
	}

	ExprBase *expression = AnalyzeExpression(ctx, syntax);

	if(!AssertValueExpression(ctx, syntax, expression))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), expression);

	return expression;
}